

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

void __thiscall
duckdb::BaseScalarFunction::BaseScalarFunction
          (BaseScalarFunction *this,string *name_p,vector<duckdb::LogicalType,_true> *arguments_p,
          LogicalType *return_type_p,FunctionStability stability,LogicalType *varargs_p,
          FunctionNullHandling null_handling,FunctionErrors errors)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_88;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  LogicalType local_48;
  
  local_88._M_dataplus._M_p = (name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&name_p->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LogicalType::LogicalType(&local_48,varargs_p);
  SimpleFunction::SimpleFunction
            (&this->super_SimpleFunction,&local_88,(vector<duckdb::LogicalType,_true> *)&local_68,
             &local_48);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  (this->super_SimpleFunction).super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_019937c0;
  LogicalType::LogicalType(&this->return_type,return_type_p);
  this->stability = stability;
  this->null_handling = null_handling;
  this->errors = errors;
  this->collation_handling = PROPAGATE_COLLATIONS;
  return;
}

Assistant:

BaseScalarFunction::BaseScalarFunction(string name_p, vector<LogicalType> arguments_p, LogicalType return_type_p,
                                       FunctionStability stability, LogicalType varargs_p,
                                       FunctionNullHandling null_handling, FunctionErrors errors)
    : SimpleFunction(std::move(name_p), std::move(arguments_p), std::move(varargs_p)),
      return_type(std::move(return_type_p)), stability(stability), null_handling(null_handling), errors(errors),
      collation_handling(FunctionCollationHandling::PROPAGATE_COLLATIONS) {
}